

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O0

Var Js::JavascriptOperators::OP_DeleteRootProperty
              (Var instance,PropertyId propertyId,ScriptContext *scriptContext,
              PropertyOperationFlags propertyOperationFlags)

{
  code *pcVar1;
  bool bVar2;
  BOOL value;
  undefined4 *puVar3;
  JavascriptLibrary *this;
  JavascriptBoolean *pJVar4;
  RootObjectBase *rootObject;
  PropertyOperationFlags propertyOperationFlags_local;
  ScriptContext *scriptContext_local;
  PropertyId propertyId_local;
  Var instance_local;
  
  bVar2 = VarIs<Js::RootObjectBase>(instance);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                ,0xc54,"(VarIs<RootObjectBase>(instance))",
                                "Root must be a global object!");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  this = ScriptContext::GetLibrary(scriptContext);
  value = (**(code **)(*instance + 0x380))(instance,propertyId,propertyOperationFlags);
  pJVar4 = JavascriptLibrary::CreateBoolean(this,value);
  return pJVar4;
}

Assistant:

Var JavascriptOperators::OP_DeleteRootProperty(Var instance, PropertyId propertyId, ScriptContext* scriptContext, PropertyOperationFlags propertyOperationFlags)
    {
        // In Edge the root is an External Object which can call Dispose and thus, can have reentrancy.
        JIT_HELPER_REENTRANT_HEADER(Op_DeleteRootProperty);
        AssertMsg(VarIs<RootObjectBase>(instance), "Root must be a global object!");
        RootObjectBase* rootObject = static_cast<RootObjectBase*>(instance);

        return scriptContext->GetLibrary()->CreateBoolean(
            rootObject->DeleteRootProperty(propertyId, propertyOperationFlags));
        JIT_HELPER_END(Op_DeleteRootProperty);
    }